

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::Module::GetExtInstImportId(Module *this,char *extstr)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  Operand *this_00;
  string local_60;
  Instruction *local_40;
  Instruction *ei;
  iterator __end2;
  iterator __begin2;
  InstructionList *__range2;
  char *extstr_local;
  Module *this_local;
  
  InstructionList::begin((InstructionList *)&__end2);
  InstructionList::end((InstructionList *)&ei);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&ei);
    if (!bVar1) {
      return 0;
    }
    local_40 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    this_00 = opt::Instruction::GetInOperand(local_40,0);
    Operand::AsString_abi_cxx11_(&local_60,this_00);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (iVar2 == 0) break;
    InstructionList::iterator::operator++(&__end2);
  }
  uVar3 = opt::Instruction::result_id(local_40);
  return uVar3;
}

Assistant:

uint32_t Module::GetExtInstImportId(const char* extstr) {
  for (auto& ei : ext_inst_imports_)
    if (!ei.GetInOperand(0).AsString().compare(extstr)) return ei.result_id();
  return 0;
}